

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CheckVisibilityRules
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  DescriptorPool *pDVar1;
  _Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
  _Var2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  pointer pDVar3;
  pointer pEVar4;
  Descriptor *descriptor;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  EnumDescriptor *descriptor_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_01;
  ServiceDescriptor *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar5;
  DescriptorAndProto *nested;
  DescriptorBuilder *pDVar6;
  DescriptorBuilder *pDVar7;
  int i;
  int iVar8;
  int i_4;
  int index;
  string_view element_name;
  string_view element_name_00;
  DescriptorBuilder *local_b0;
  VisibilityCheckerState *local_a8;
  VoidPtr local_a0;
  code *pcStack_98;
  VoidPtr local_90;
  code *pcStack_88;
  VisibilityCheckerState state;
  
  local_a8 = &state;
  state.namespaced_enums.
  super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.namespaced_enums.
  super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.nested_enums.
  super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.nested_enums.
  super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.nested_messages.
  super__Vector_base<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.nested_enums.
  super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.nested_messages.
  super__Vector_base<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.nested_messages.
  super__Vector_base<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.namespaced_enums.
  super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = this;
  for (iVar8 = 0; iVar8 < file->message_type_count_; iVar8 = iVar8 + 1) {
    descriptor = FileDescriptor::message_type(file,iVar8);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,iVar8);
    internal::
    VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::$_2>>
    ::Visit<google::protobuf::DescriptorProto_const>
              ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__2>>
                *)&local_b0,descriptor,proto_00);
  }
  for (iVar8 = 0; iVar8 < file->enum_type_count_; iVar8 = iVar8 + 1) {
    descriptor_00 = FileDescriptor::enum_type(file,iVar8);
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar8);
    internal::
    VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::$_2>>
    ::Visit<google::protobuf::EnumDescriptorProto_const>
              ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__2>>
                *)&local_b0,descriptor_00,proto_01);
  }
  for (iVar8 = 0; iVar8 < file->extension_count_; iVar8 = iVar8 + 1) {
    FileDescriptor::extension(file,iVar8);
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
              (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar8);
  }
  for (iVar8 = 0;
      pDVar3 = state.nested_messages.
               super__Vector_base<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      pDVar6 = (DescriptorBuilder *)
               state.nested_messages.
               super__Vector_base<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
               ._M_impl.super__Vector_impl_data._M_start, iVar8 < file->service_count_;
      iVar8 = iVar8 + 1) {
    this_00 = FileDescriptor::service(file,iVar8);
    pVVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                       (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,iVar8);
    for (index = 0; index < this_00->method_count_; index = index + 1) {
      ServiceDescriptor::method(this_00,index);
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                (&(pVVar5->field_0)._impl_.method_.super_RepeatedPtrFieldBase,index);
    }
  }
  for (; pEVar4 = state.nested_enums.
                  super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      pDVar7 = (DescriptorBuilder *)
               state.nested_enums.
               super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
               ._M_impl.super__Vector_impl_data._M_start, pDVar6 != (DescriptorBuilder *)pDVar3;
      pDVar6 = (DescriptorBuilder *)&pDVar6->deferred_validation_) {
    pDVar1 = pDVar6->pool_;
    if ((((pDVar1->field_memo_table_mutex_).mu_.super___atomic_base<long>._M_i & 0x30000) == 0x20000
        ) && (*(int *)((long)&((pDVar1->tables_)._M_t.
                               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               .
                               super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                              ._M_head_impl)->known_bad_symbols_ + 0x14) == 4)) {
      element_name._M_len =
           (ulong)*(ushort *)((long)&(pDVar1->mutex_->mu_).super___atomic_base<long>._M_i + 2);
      element_name._M_str =
           (char *)((long)&(pDVar1->mutex_->mu_).super___atomic_base<long>._M_i +
                   ~element_name._M_len);
      pcStack_88 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      local_90.obj = &local_b0;
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      make_error.ptr_.obj = local_90.obj;
      local_b0 = pDVar6;
      AddError(this,element_name,(Message *)pDVar6->tables_,INPUT_TYPE,make_error);
    }
  }
  for (; pDVar7 != (DescriptorBuilder *)pEVar4;
      pDVar7 = (DescriptorBuilder *)&pDVar7->deferred_validation_) {
    pDVar1 = pDVar7->pool_;
    if ((((pDVar1->field_memo_table_mutex_).mu_.super___atomic_base<long>._M_i & 0xc00) == 0x800) &&
       (*(int *)((pDVar1->dispatcher_)._M_t.
                 super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                 .
                 super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                 ._M_head_impl + 0x4c) == 4)) {
      _Var2._M_head_impl =
           (pDVar1->field_memo_table_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
           ._M_head_impl;
      element_name_00._M_len =
           (ulong)*(ushort *)
                   ((long)&(_Var2._M_head_impl)->
                           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                   + 2);
      element_name_00._M_str =
           (char *)((long)&(_Var2._M_head_impl)->
                           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                   + ~element_name_00._M_len);
      pcStack_98 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__1,std::__cxx11::string>
      ;
      local_a0.obj = &local_b0;
      make_error_00.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__1,std::__cxx11::string>
      ;
      make_error_00.ptr_.obj = local_a0.obj;
      local_b0 = pDVar7;
      AddError(this,element_name_00,(Message *)pDVar7->tables_,INPUT_TYPE,make_error_00);
    }
  }
  VisibilityCheckerState::~VisibilityCheckerState(&state);
  return;
}

Assistant:

void DescriptorBuilder::CheckVisibilityRules(FileDescriptor* file,
                                             const FileDescriptorProto& proto) {
  // Check DefaultSymbolVisibility first.
  //
  // For Edition 2024:
  // If DefaultSymbolVisibility is STRICT enforce it with caveats for:
  //

  VisibilityCheckerState state;

  // Build our state object so we can apply rules based on type.
  internal::VisitDescriptors(
      *file, proto,
      [&](const auto& descriptor, const auto& proto)
          -> decltype(CheckVisibilityRulesVisit(descriptor, proto, state)) {
        CheckVisibilityRulesVisit(descriptor, proto, state);
      });

  // In edition 2024 we only enforce STRICT visibilty rules. There are possibly
  // more rules to come in future editions, but for now just apply the rule for
  // enforcing nested symbol local visibilty. There is a single caveat for,
  // allowing nested enums to have visibility set only when
  //
  // local msg { export enum {} reserved 1 to max; }
  for (auto& nested : state.nested_messages) {
    if (nested.descriptor->visibility_keyword() ==
            SymbolVisibility::VISIBILITY_EXPORT &&
        nested.descriptor->features().default_symbol_visibility() ==
            FeatureSet::VisibilityFeature::STRICT) {
      AddError(
          nested.descriptor->full_name(), *nested.proto,
          DescriptorPool::ErrorCollector::INPUT_TYPE, [&] {
            return absl::StrCat(
                "\"", nested.descriptor->name(),
                "\" is a nested message and cannot be `export` with STRICT "
                "default_symbol_visibility. It must be moved to top-level, "
                "ideally "
                "in its own file in order to be `export`.");
          });
    }
  }

  for (auto& nested : state.nested_enums) {
    if (nested.descriptor->visibility_keyword() ==
            SymbolVisibility::VISIBILITY_EXPORT &&
        nested.descriptor->features().default_symbol_visibility() ==
            FeatureSet::VisibilityFeature::STRICT) {
      // This list contains only enums not considered 'namespaced' by
      // IsEnumNamespaceMessage

      AddError(nested.descriptor->full_name(), *nested.proto,
               DescriptorPool::ErrorCollector::INPUT_TYPE, [&] {
                 return absl::StrCat(
                     "\"", nested.descriptor->name(),
                     "\" is a nested enum and cannot be marked `export` with "
                     "STRICT "
                     "default_symbol_visibility. It must be moved to "
                     "top-level, ideally "
                     "in its own file in order to be `export`. For C++ "
                     "namespacing of enums in a messages use: `local "
                     "message <OuterNamespace> { export enum ",
                     nested.descriptor->name(), " {...} reserved 1 to max; }`");
               });
    }

    // Enforce Future rules here:
  }
}